

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddCallback(ImDrawList *this,ImDrawCallback callback,void *callback_data)

{
  uint uVar1;
  ImDrawCmd *pIVar2;
  long lVar3;
  
  uVar1 = (this->CmdBuffer).Size;
  if ((ulong)uVar1 == 0) {
    pIVar2 = (ImDrawCmd *)0x0;
  }
  else {
    if ((int)uVar1 < 1) goto LAB_0017f2d9;
    pIVar2 = (this->CmdBuffer).Data + ((ulong)uVar1 - 1);
  }
  if (((pIVar2 == (ImDrawCmd *)0x0) || (pIVar2->ElemCount != 0)) ||
     (pIVar2->UserCallback != (ImDrawCallback)0x0)) {
    AddDrawCmd(this);
    lVar3 = (long)(this->CmdBuffer).Size;
    if (lVar3 < 1) {
LAB_0017f2d9:
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.h"
                    ,0x4a4,"value_type &ImVector<ImDrawCmd>::back() [T = ImDrawCmd]");
    }
    pIVar2 = (this->CmdBuffer).Data + lVar3 + -1;
  }
  pIVar2->UserCallback = callback;
  pIVar2->UserCallbackData = callback_data;
  AddDrawCmd(this);
  return;
}

Assistant:

void ImDrawList::AddCallback(ImDrawCallback callback, void* callback_data)
{
    ImDrawCmd* current_cmd = CmdBuffer.Size ? &CmdBuffer.back() : NULL;
    if (!current_cmd || current_cmd->ElemCount != 0 || current_cmd->UserCallback != NULL)
    {
        AddDrawCmd();
        current_cmd = &CmdBuffer.back();
    }
    current_cmd->UserCallback = callback;
    current_cmd->UserCallbackData = callback_data;

    AddDrawCmd(); // Force a new command after us (see comment below)
}